

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# censor2.c
# Opt level: O0

int ssh2_censor_packet(PacketLogSettings *pls,int type,_Bool sender_is_client,ptrlen pkt,
                      logblank_t *blanks)

{
  _Bool _Var1;
  uint uVar2;
  ptrlen pVar3;
  undefined1 local_78 [8];
  BinarySource src [1];
  ptrlen str;
  int nblanks;
  logblank_t *blanks_local;
  _Bool sender_is_client_local;
  int type_local;
  PacketLogSettings *pls_local;
  ptrlen pkt_local;
  
  str.len._4_4_ = 0;
  BinarySource_INIT__((BinarySource *)local_78,pkt);
  if (((pls->omit_data & 1U) != 0) && ((type == 0x5e || (type == 0x5f)))) {
    BinarySource_get_uint32((BinarySource *)src[0]._24_8_);
    if (type == 0x5f) {
      BinarySource_get_uint32((BinarySource *)src[0]._24_8_);
    }
    pVar3 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
    str.len._4_1_ = *(int *)(src[0]._24_8_ + 0x18) == 0;
    if (str.len._4_1_) {
      blanks->offset = (int)src[0].data - (int)pVar3.len;
      blanks->type = 2;
      blanks->len = (int)pVar3.len;
    }
    str.len._5_3_ = 0;
  }
  uVar2 = str.len._4_4_;
  if ((sender_is_client) && ((pls->omit_passwords & 1U) != 0)) {
    if (type == 0x32) {
      BinarySource_get_string((BinarySource *)src[0]._24_8_);
      BinarySource_get_string((BinarySource *)src[0]._24_8_);
      pVar3 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
      _Var1 = ptrlen_eq_string(pVar3,"password");
      if (_Var1) {
        BinarySource_get_bool((BinarySource *)src[0]._24_8_);
        pVar3 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
        if (*(int *)(src[0]._24_8_ + 0x18) == 0) {
          if (3 < str.len._4_4_) {
            __assert_fail("nblanks < MAX_BLANKS",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/censor2.c"
                          ,0x32,
                          "int ssh2_censor_packet(const PacketLogSettings *, int, _Bool, ptrlen, logblank_t *)"
                         );
          }
          blanks[(int)str.len._4_4_].offset = (int)src[0].data - (int)pVar3.len;
          blanks[(int)str.len._4_4_].type = 1;
          blanks[(int)str.len._4_4_].len = (int)pVar3.len;
          uVar2 = str.len._4_4_ + 1;
          BinarySource_get_string((BinarySource *)src[0]._24_8_);
          if (*(int *)(src[0]._24_8_ + 0x18) == 0) {
            blanks[(int)str.len._4_4_].len = (int)src[0].data - blanks[(int)uVar2].offset;
          }
        }
      }
    }
    else if ((pls->actx == SSH2_PKTCTX_KBDINTER) && (type == 0x3d)) {
      BinarySource_get_uint32((BinarySource *)src[0]._24_8_);
      if (3 < str.len._4_4_) {
        __assert_fail("nblanks < MAX_BLANKS",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/censor2.c"
                      ,0x44,
                      "int ssh2_censor_packet(const PacketLogSettings *, int, _Bool, ptrlen, logblank_t *)"
                     );
      }
      blanks[(int)str.len._4_4_].offset = (int)src[0].data;
      blanks[(int)str.len._4_4_].type = 1;
      do {
        BinarySource_get_string((BinarySource *)src[0]._24_8_);
      } while (*(int *)(src[0]._24_8_ + 0x18) == 0);
      blanks[(int)str.len._4_4_].len = (int)src[0].data - blanks[(int)str.len._4_4_].offset;
      uVar2 = str.len._4_4_ + 1;
    }
    else if (type == 0x62) {
      BinarySource_get_uint32((BinarySource *)src[0]._24_8_);
      pVar3 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
      _Var1 = ptrlen_eq_string(pVar3,"x11-req");
      if (_Var1) {
        BinarySource_get_bool((BinarySource *)src[0]._24_8_);
        BinarySource_get_bool((BinarySource *)src[0]._24_8_);
        BinarySource_get_string((BinarySource *)src[0]._24_8_);
        pVar3 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
        if (*(int *)(src[0]._24_8_ + 0x18) == 0) {
          if (3 < str.len._4_4_) {
            __assert_fail("nblanks < MAX_BLANKS",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/censor2.c"
                          ,0x60,
                          "int ssh2_censor_packet(const PacketLogSettings *, int, _Bool, ptrlen, logblank_t *)"
                         );
          }
          blanks[(int)str.len._4_4_].offset = (int)src[0].data - (int)pVar3.len;
          blanks[(int)str.len._4_4_].type = 1;
          blanks[(int)str.len._4_4_].len = (int)pVar3.len;
          uVar2 = str.len._4_4_ + 1;
        }
      }
    }
  }
  str.len._4_4_ = uVar2;
  return str.len._4_4_;
}

Assistant:

int ssh2_censor_packet(
    const PacketLogSettings *pls, int type, bool sender_is_client,
    ptrlen pkt, logblank_t *blanks)
{
    int nblanks = 0;
    ptrlen str;
    BinarySource src[1];

    BinarySource_BARE_INIT_PL(src, pkt);

    if (pls->omit_data &&
        (type == SSH2_MSG_CHANNEL_DATA ||
         type == SSH2_MSG_CHANNEL_EXTENDED_DATA)) {
        /* "Session data" packets - omit the data string. */
        get_uint32(src);              /* skip channel id */
        if (type == SSH2_MSG_CHANNEL_EXTENDED_DATA)
            get_uint32(src);          /* skip extended data type */
        str = get_string(src);
        if (!get_err(src)) {
            assert(nblanks < MAX_BLANKS);
            blanks[nblanks].offset = src->pos - str.len;
            blanks[nblanks].type = PKTLOG_OMIT;
            blanks[nblanks].len = str.len;
            nblanks++;
        }
    }

    if (sender_is_client && pls->omit_passwords) {
        if (type == SSH2_MSG_USERAUTH_REQUEST) {
            /* If this is a password packet, blank the password(s). */
            get_string(src);              /* username */
            get_string(src);              /* service name */
            str = get_string(src);        /* auth method */
            if (ptrlen_eq_string(str, "password")) {
                get_bool(src);
                /* Blank the password field. */
                str = get_string(src);
                if (!get_err(src)) {
                    assert(nblanks < MAX_BLANKS);
                    blanks[nblanks].offset = src->pos - str.len;
                    blanks[nblanks].type = PKTLOG_BLANK;
                    blanks[nblanks].len = str.len;
                    nblanks++;
                    /* If there's another password field beyond it
                     * (change of password), blank that too. */
                    str = get_string(src);
                    if (!get_err(src))
                        blanks[nblanks-1].len =
                            src->pos - blanks[nblanks].offset;
                }
            }
        } else if (pls->actx == SSH2_PKTCTX_KBDINTER &&
                   type == SSH2_MSG_USERAUTH_INFO_RESPONSE) {
            /* If this is a keyboard-interactive response packet,
             * blank the responses. */
            get_uint32(src);
            assert(nblanks < MAX_BLANKS);
            blanks[nblanks].offset = src->pos;
            blanks[nblanks].type = PKTLOG_BLANK;
            do {
                str = get_string(src);
            } while (!get_err(src));
            blanks[nblanks].len = src->pos - blanks[nblanks].offset;
            nblanks++;
        } else if (type == SSH2_MSG_CHANNEL_REQUEST) {
            /*
             * If this is an X forwarding request packet, blank the
             * fake auth data.
             *
             * Note that while we blank the X authentication data
             * here, we don't take any special action to blank the
             * start of an X11 channel, so using MIT-MAGIC-COOKIE-1
             * and actually opening an X connection without having
             * session blanking enabled is likely to leak your cookie
             * into the log.
             */
            get_uint32(src);
            str = get_string(src);
            if (ptrlen_eq_string(str, "x11-req")) {
                get_bool(src);
                get_bool(src);
                get_string(src);
                str = get_string(src);
                if (!get_err(src)) {
                    assert(nblanks < MAX_BLANKS);
                    blanks[nblanks].offset = src->pos - str.len;
                    blanks[nblanks].type = PKTLOG_BLANK;
                    blanks[nblanks].len = str.len;
                    nblanks++;
                }
            }
        }
    }

    return nblanks;
}